

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-softmaxes.cc
# Opt level: O1

void __thiscall
dynet::LogSoftmax::backward_dev_impl<dynet::Device_CPU>
          (LogSoftmax *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  uint uVar1;
  uint uVar2;
  Tensor *pTVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  uint local_17c;
  type local_170;
  long local_150;
  StoragePointerType local_148;
  Device_CPU *local_140;
  uint local_138 [7];
  undefined4 local_11c;
  uint local_118;
  StoragePointerType local_110;
  Device *local_108;
  undefined4 local_100;
  TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_3UL>,_const_Eigen::TensorReshapingOp<const_std::array<int,_3UL>,_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>_>_>
  local_f8;
  type local_e8;
  
  pTVar3 = *(xs->super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  uVar1 = (fx->d).bd;
  uVar7 = 1;
  if (1 < (pTVar3->d).nd) {
    uVar7 = (pTVar3->d).d[1];
  }
  local_170.m_data = (StoragePointerType)(this->super_Node).aux_mem;
  local_108 = fx->device;
  local_11c = 1;
  local_100 = 0;
  uVar2 = (dEdf->d).nd;
  if (uVar2 == 2) {
    uVar4 = (dEdf->d).d[0];
    local_e8.m_lhs_xpr.m_dimensions.super_array<long,_3>._M_elems[1] = (long)(int)(dEdf->d).d[1];
  }
  else {
    uVar4 = 1;
    if (uVar2 != 0) {
      uVar4 = (dEdf->d).d[0];
    }
    local_e8.m_lhs_xpr.m_dimensions.super_array<long,_3>._M_elems[1] = 1;
  }
  local_e8.m_lhs_xpr.m_dimensions.super_array<long,_3>._M_elems[2] = (long)(int)(dEdf->d).bd;
  local_e8.m_lhs_xpr.m_dimensions.super_array<long,_3>._M_elems[0] = (long)(int)uVar4;
  local_e8.m_lhs_xpr.m_data = dEdf->v;
  local_f8.m_rhs_xpr = &local_e8;
  local_e8.m_rhs_xpr.m_lhs_xpr.m_lhs_xpr.m_xpr.m_data =
       (StoragePointerType)
       ((ulong)local_e8.m_rhs_xpr.m_lhs_xpr.m_lhs_xpr.m_xpr.m_data & 0xffffffff00000000);
  local_170.m_dimensions.super_array<long,_3>._M_elems[0] = (long)(int)uVar7;
  local_170.m_dimensions.super_array<long,_3>._M_elems[1] = (long)(int)uVar1;
  local_f8.m_lhs_xpr = &local_170;
  local_148 = local_170.m_data;
  local_140 = dev;
  local_138[0] = uVar7;
  local_118 = uVar1;
  local_110 = local_170.m_data;
  Eigen::internal::
  TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,_const_std::array<int,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::MakePointer>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)0>
  ::run((TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,_const_std::array<int,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::MakePointer>_>
         *)&local_f8,dev->edevice);
  iVar8 = 1;
  lVar6 = 0;
  do {
    iVar8 = iVar8 * local_138[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 1);
  uVar2 = (dEdf->d).nd;
  if (uVar2 == 2) {
    local_17c = (dEdf->d).d[0];
    local_e8.m_rhs_xpr.m_rhs_xpr.m_dimensions.super_array<long,_3>._M_elems[1] =
         (long)(int)(dEdf->d).d[1];
  }
  else {
    local_17c = 1;
    if (uVar2 != 0) {
      local_17c = (dEdf->d).d[0];
    }
    local_e8.m_rhs_xpr.m_rhs_xpr.m_dimensions.super_array<long,_3>._M_elems[1] = 1;
  }
  local_e8.m_rhs_xpr.m_lhs_xpr.m_rhs_xpr.m_xpr.m_broadcast._M_elems[0] = (fx->d).d[0];
  uVar2 = (fx->d).nd;
  local_e8.m_rhs_xpr.m_lhs_xpr.m_lhs_xpr.m_xpr.m_dimensions.super_array<long,_3>._M_elems[2] =
       (long)(int)(fx->d).bd;
  local_e8.m_rhs_xpr.m_lhs_xpr.m_lhs_xpr.m_xpr.m_data = fx->v;
  local_e8.m_rhs_xpr.m_rhs_xpr.m_data = dEdf->v;
  local_150 = (long)(int)(dEdf->d).bd;
  uVar4 = (dEdxi->d).nd;
  local_170.m_data = dEdxi->v;
  local_170.m_dimensions.super_array<long,_3>._M_elems[2] = (long)(int)(dEdxi->d).bd;
  if (uVar4 == 2) {
    uVar5 = (dEdxi->d).d[0];
    local_170.m_dimensions.super_array<long,_3>._M_elems[1] = (long)(int)(dEdxi->d).d[1];
  }
  else {
    uVar5 = 1;
    if (uVar4 != 0) {
      uVar5 = (dEdxi->d).d[0];
    }
    local_170.m_dimensions.super_array<long,_3>._M_elems[1] = 1;
  }
  local_170.m_dimensions.super_array<long,_3>._M_elems[0] = (long)(int)uVar5;
  uVar5 = 1;
  uVar4 = local_e8.m_rhs_xpr.m_lhs_xpr.m_rhs_xpr.m_xpr.m_broadcast._M_elems[0];
  if (uVar2 == 0) {
    uVar4 = uVar5;
  }
  if (uVar2 == 2) {
    uVar4 = local_e8.m_rhs_xpr.m_lhs_xpr.m_rhs_xpr.m_xpr.m_broadcast._M_elems[0];
    uVar5 = (fx->d).d[1];
  }
  local_e8.m_rhs_xpr.m_lhs_xpr.m_rhs_xpr.m_xpr.m_xpr.m_xpr.m_dimensions.super_array<long,_1>.
  _M_elems[0]._0_4_ = iVar8 * uVar1;
  local_e8.m_rhs_xpr.m_lhs_xpr.m_rhs_xpr.m_xpr.m_xpr.m_xpr.m_dimensions.super_array<long,_1>.
  _M_elems[0]._4_4_ = 0;
  local_e8.m_rhs_xpr.m_lhs_xpr.m_lhs_xpr.m_xpr.m_dimensions.super_array<long,_3>._M_elems[0] =
       (long)(int)uVar4;
  local_e8.m_rhs_xpr.m_lhs_xpr.m_lhs_xpr.m_xpr.m_dimensions.super_array<long,_3>._M_elems[1] =
       (long)(int)uVar5;
  local_e8.m_rhs_xpr.m_lhs_xpr.m_rhs_xpr.m_xpr.m_xpr.m_xpr.m_data = local_148;
  local_e8.m_rhs_xpr.m_lhs_xpr.m_rhs_xpr.m_xpr.m_xpr.m_dims._M_elems[0] = 1;
  local_e8.m_rhs_xpr.m_lhs_xpr.m_rhs_xpr.m_xpr.m_broadcast._M_elems[1] = 1;
  local_e8.m_rhs_xpr.m_lhs_xpr.m_rhs_xpr.m_xpr.m_broadcast._M_elems[2] = 1;
  local_e8.m_rhs_xpr.m_rhs_xpr.m_dimensions.super_array<long,_3>._M_elems[0] = (long)(int)local_17c;
  local_f8.m_lhs_xpr = &local_170;
  local_f8.m_rhs_xpr = &local_e8;
  local_e8.m_lhs_xpr.m_data = local_170.m_data;
  local_e8.m_lhs_xpr.m_dimensions.super_array<long,_3>._M_elems[0] =
       local_170.m_dimensions.super_array<long,_3>._M_elems[0];
  local_e8.m_lhs_xpr.m_dimensions.super_array<long,_3>._M_elems[1] =
       local_170.m_dimensions.super_array<long,_3>._M_elems[1];
  local_e8.m_lhs_xpr.m_dimensions.super_array<long,_3>._M_elems[2] =
       local_170.m_dimensions.super_array<long,_3>._M_elems[2];
  local_e8.m_rhs_xpr.m_lhs_xpr.m_rhs_xpr.m_xpr.m_xpr.m_dims._M_elems[1] = uVar7;
  local_e8.m_rhs_xpr.m_lhs_xpr.m_rhs_xpr.m_xpr.m_xpr.m_dims._M_elems[2] = uVar1;
  local_e8.m_rhs_xpr.m_rhs_xpr.m_dimensions.super_array<long,_3>._M_elems[2] = local_150;
  Eigen::internal::
  TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_3UL>,_const_Eigen::TensorReshapingOp<const_std::array<int,_3UL>,_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_3,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)1>
  ::run(&local_f8,local_140->edevice);
  return;
}

Assistant:

void LogSoftmax::backward_dev_impl(const MyDevice & dev,
                             const vector<const Tensor*>& xs,
                             const Tensor& fx,
                             const Tensor& dEdf,
                             unsigned i,
                             Tensor& dEdxi) const {
  Tensor z(Dim({xs[0]->d.cols()},fx.d.bd), (float*)aux_mem, fx.device, DeviceMempool::FXS);
  // TODO? Is this broadcast efficient on CPU?
  Eigen::array<int, 1> red_axis; red_axis[0] = 0;
  z.tb<1>().device(*dev.edevice) = dEdf.tb<2>().sum(red_axis);
  Eigen::array<int, 3> bcast = {(int)fx.d.rows(), 1, 1};
  Eigen::array<int, 3> morph = {1, (int)z.d[0], (int)z.d.bd};
  dEdxi.tb<2>().device(*dev.edevice) += fx.tb<2>().exp() * -z.tvec().reshape(morph).broadcast(bcast) + dEdf.tb<2>();
}